

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveHeaderSize::exec(CDirectiveHeaderSize *this)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  bool bVar5;
  int64_t physicalAddress;
  shared_ptr<GenericAssemblerFile> file;
  undefined1 local_20 [8];
  shared_ptr<AssemblerFile> openFile;
  CDirectiveHeaderSize *this_local;
  
  openFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  FileManager::getOpenFile((FileManager *)local_20);
  peVar3 = std::__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  uVar1 = (*peVar3->_vptr_AssemblerFile[0xc])();
  bVar5 = (uVar1 & 1) != 0;
  if (bVar5) {
    std::static_pointer_cast<GenericAssemblerFile,AssemblerFile>
              ((shared_ptr<AssemblerFile> *)&physicalAddress);
    peVar4 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&physicalAddress);
    iVar2 = (*(peVar4->super_AssemblerFile)._vptr_AssemblerFile[7])();
    peVar4 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&physicalAddress);
    GenericAssemblerFile::setHeaderSize(peVar4,this->headerSize);
    peVar4 = std::
             __shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&physicalAddress);
    (*(peVar4->super_AssemblerFile)._vptr_AssemblerFile[10])(peVar4,CONCAT44(extraout_var,iVar2));
    std::shared_ptr<GenericAssemblerFile>::~shared_ptr
              ((shared_ptr<GenericAssemblerFile> *)&physicalAddress);
  }
  else {
    Logger::printError<>(Error,"Header size not applicable for this file");
  }
  file.super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_3_
       = 0;
  file.super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_
       = !bVar5;
  std::shared_ptr<AssemblerFile>::~shared_ptr((shared_ptr<AssemblerFile> *)local_20);
  return;
}

Assistant:

void CDirectiveHeaderSize::exec() const
{
	std::shared_ptr<AssemblerFile> openFile = g_fileManager->getOpenFile();
	if (!openFile->hasFixedVirtualAddress())
	{
		Logger::printError(Logger::Error, "Header size not applicable for this file");
		return;
	}
	std::shared_ptr<GenericAssemblerFile> file = std::static_pointer_cast<GenericAssemblerFile>(openFile);
	int64_t physicalAddress = file->getPhysicalAddress();
	file->setHeaderSize(headerSize);
	file->seekPhysical(physicalAddress);
}